

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O1

void __thiscall depspawn::internal::ThreadPool::main(ThreadPool *this)

{
  int iVar1;
  undefined8 uVar2;
  unique_lock<std::mutex> my_lock;
  unique_lock<std::mutex> local_40;
  
  if (this->finish_ == false) {
    do {
      local_40._M_owns = false;
      local_40._M_device = &this->mutex_;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      if (this->ready_ == false) {
        do {
          if (this->finish_ != false) break;
          std::condition_variable::wait((unique_lock *)&this->cond_var_);
        } while (this->ready_ != true);
      }
      iVar1 = this->count_;
      this->count_ = iVar1 + 1;
      if ((long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)this->count_) {
        this->ready_ = false;
      }
      std::unique_lock<std::mutex>::unlock(&local_40);
      if ((this->finish_ != true) && (iVar1 < this->nthreads_in_use_)) {
        if ((this->func_).super__Function_base._M_manager == (_Manager_type)0x0) {
          uVar2 = std::__throw_bad_function_call();
          std::unique_lock<std::mutex>::~unique_lock(&local_40);
          _Unwind_Resume(uVar2);
        }
        (*(this->func_)._M_invoker)((_Any_data *)&this->func_);
      }
      do {
        if (this->ready_ != true) break;
      } while (this->finish_ != true);
      std::unique_lock<std::mutex>::lock(&local_40);
      this->count_ = this->count_ + -1;
      std::unique_lock<std::mutex>::unlock(&local_40);
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    } while (this->finish_ != true);
  }
  return;
}

Assistant:

void main()
  {
    while (!finish_) {
      std::unique_lock<std::mutex> my_lock(mutex_);
      while (!ready_ && !finish_) {
        cond_var_.wait(my_lock);
      }
      const int my_id = count_++;
      if(count_ == threads_.size()) {
        ready_ = false;
      }
      my_lock.unlock();

      if (!finish_ && (my_id < nthreads_in_use_)) {
        func_();
      }

      while(ready_ && !finish_) {} // ensure all threads restarted
      my_lock.lock();
      count_--;
      my_lock.unlock();

      //wait();
    }
  }